

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O2

ssize_t send_all(int fd,msghdr *msg,int flags)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  for (uVar1 = 0; uVar3 = (ulong)uVar1, uVar3 < msg->msg_iovlen; uVar1 = uVar1 + 1) {
    memcpy(send_buffer + lVar2,msg->msg_iov[uVar3].iov_base,msg->msg_iov[uVar3].iov_len);
    lVar2 = lVar2 + msg->msg_iov[uVar3].iov_len;
  }
  return lVar2;
}

Assistant:

static ssize_t send_all(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	ssize_t len = 0;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, msg->msg_iov[i].iov_len);
		len += (ssize_t)msg->msg_iov[i].iov_len;
	}

	return len;
}